

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnv_hash.c
# Opt level: O1

uint32_t fnv1_hash_data(void *data,size_t size)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *bytes;
  
  uVar1 = 0x811c9dc5;
  if (size != 0) {
    sVar2 = 0;
    do {
      uVar1 = (*(byte *)((long)data + sVar2) ^ uVar1) * 0x1000193;
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  return uVar1;
}

Assistant:

uint32_t
fnv1_hash_data(const void *data, size_t size)
{
	uint32_t hash = 2166136261ul;
	const uint8_t *bytes = (uint8_t *)data;

	while (size-- != 0) {
		hash ^= *bytes;
		hash = hash * 0x01000193;
		bytes++;
	}

	return hash;
}